

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::readHSharedObject(QPDF *this,BitStream h)

{
  int iVar1;
  pointer pMVar2;
  size_t sVar3;
  reference pvVar4;
  int local_34;
  ulong uStack_30;
  int j;
  size_t i;
  pointer *ppHStack_20;
  int nitems;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *entries;
  HSharedObject *t;
  QPDF *this_local;
  
  t = (HSharedObject *)this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  entries = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
            &pMVar2->shared_object_hints;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  *(int *)&(entries->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_start = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  (entries->super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(long)iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  *(int *)&(entries->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(entries->
                  super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  *(int *)&entries[1].
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>.
           _M_impl.super__Vector_impl_data._M_start = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&entries[1].
                  super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  *(int *)&entries[1].
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish = iVar1;
  QTC::TC("qpdf","QPDF lin nshared_total > nshared_first_page",
          (uint)(*(int *)&(entries->
                          super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage <
                *(int *)((long)&(entries->
                                super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                                )._M_impl.super__Vector_impl_data._M_end_of_storage + 4)));
  ppHStack_20 = &entries[1].
                 super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::clear
            ((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ppHStack_20);
  i._4_4_ = *(int *)((long)&(entries->
                            super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  load_vector_int<QPDF::HSharedObjectEntry,int>
            (&h,i._4_4_,
             (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ppHStack_20,
             *(int *)&entries[1].
                      super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish,0);
  load_vector_int<QPDF::HSharedObjectEntry,int>
            (&h,i._4_4_,
             (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ppHStack_20,1,4);
  for (uStack_30 = 0; sVar3 = toS<int>((int *)((long)&i + 4)), uStack_30 < sVar3;
      uStack_30 = uStack_30 + 1) {
    pvVar4 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       ((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                         *)ppHStack_20,uStack_30);
    if (pvVar4->signature_present != 0) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        BitStream::getBits(&h,0x20);
      }
    }
  }
  load_vector_int<QPDF::HSharedObjectEntry,int>
            (&h,i._4_4_,
             (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ppHStack_20,
             *(int *)&entries[1].
                      super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,8);
  return;
}

Assistant:

void
QPDF::readHSharedObject(BitStream h)
{
    HSharedObject& t = m->shared_object_hints;

    t.first_shared_obj = h.getBitsInt(32);         // 1
    t.first_shared_offset = h.getBitsInt(32);      // 2
    t.nshared_first_page = h.getBitsInt(32);       // 3
    t.nshared_total = h.getBitsInt(32);            // 4
    t.nbits_nobjects = h.getBitsInt(16);           // 5
    t.min_group_length = h.getBitsInt(32);         // 6
    t.nbits_delta_group_length = h.getBitsInt(16); // 7

    QTC::TC(
        "qpdf",
        "QPDF lin nshared_total > nshared_first_page",
        (t.nshared_total > t.nshared_first_page) ? 1 : 0);

    std::vector<HSharedObjectEntry>& entries = t.entries;
    entries.clear();
    int nitems = t.nshared_total;
    load_vector_int(
        h, nitems, entries, t.nbits_delta_group_length, &HSharedObjectEntry::delta_group_length);
    load_vector_int(h, nitems, entries, 1, &HSharedObjectEntry::signature_present);
    for (size_t i = 0; i < toS(nitems); ++i) {
        if (entries.at(i).signature_present) {
            // Skip 128-bit MD5 hash.  These are not supported by acrobat, so they should probably
            // never be there.  We have no test case for this.
            for (int j = 0; j < 4; ++j) {
                (void)h.getBits(32);
            }
        }
    }
    load_vector_int(h, nitems, entries, t.nbits_nobjects, &HSharedObjectEntry::nobjects_minus_one);
}